

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGeneratingBooleanExpression
               (ParseNode *expr,ByteCodeLabel trueLabel,bool truefallthrough,
               ByteCodeLabel falseLabel,bool falsefallthrough,RegSlot writeto,bool reuseLoc,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  RegSlot R0;
  RegSlot R1;
  ParseNode *pnode1;
  OpCode OVar1;
  ByteCodeLabel BVar2;
  ByteCodeLabel trueLabel_00;
  ParseNodeBin *pPVar3;
  ParseNodeUni *pPVar4;
  ByteCodeWriter *pBVar5;
  ByteCodeLabel emitFalse;
  ByteCodeLabel emitTrue;
  ByteCodeLabel leftTrue;
  ByteCodeLabel leftFalse;
  bool reuseLoc_local;
  RegSlot writeto_local;
  bool falsefallthrough_local;
  ByteCodeLabel falseLabel_local;
  bool truefallthrough_local;
  ByteCodeLabel trueLabel_local;
  ParseNode *expr_local;
  
  switch(expr->nop) {
  case knopFalse:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar1 = LdFalse;
    if (reuseLoc) {
      OVar1 = LdFalse_ReuseLoc;
    }
    Js::ByteCodeWriter::Reg1(pBVar5,OVar1,writeto);
    if (!falsefallthrough) {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar5,falseLabel);
    }
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    break;
  case knopTrue:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar1 = LdTrue;
    if (reuseLoc) {
      OVar1 = LdTrue_ReuseLoc;
    }
    Js::ByteCodeWriter::Reg1(pBVar5,OVar1,writeto);
    if (!truefallthrough) {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar5,trueLabel);
    }
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    break;
  default:
    if ((expr->nop == knopName) || (expr->nop == knopDot)) {
      ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
      Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      OVar1 = Ld_A;
      if (reuseLoc) {
        OVar1 = Ld_A_ReuseLoc;
      }
      Js::ByteCodeWriter::Reg2(pBVar5,OVar1,writeto,expr->location);
      if ((truefallthrough) || (falsefallthrough)) {
        if ((!truefallthrough) || (falsefallthrough)) {
          if ((falsefallthrough) && (!truefallthrough)) {
            pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
            Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
          }
        }
        else {
          pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::BrReg1(pBVar5,BrFalse_A,falseLabel,expr->location);
        }
      }
      else {
        pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
        pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Br(pBVar5,falseLabel);
      }
      ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    }
    else {
      Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      OVar1 = Ld_A;
      if (reuseLoc) {
        OVar1 = Ld_A_ReuseLoc;
      }
      Js::ByteCodeWriter::Reg2(pBVar5,OVar1,writeto,expr->location);
      if ((truefallthrough) || (falsefallthrough)) {
        if ((!truefallthrough) || (falsefallthrough)) {
          if ((falsefallthrough) && (!truefallthrough)) {
            pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
            Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
          }
        }
        else {
          pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::BrReg1(pBVar5,BrFalse_A,falseLabel,expr->location);
        }
      }
      else {
        pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
        pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Br(pBVar5,falseLabel);
      }
    }
    break;
  case knopLogNot:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar2 = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    trueLabel_00 = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pPVar4 = ParseNode::AsParseNodeUni(expr);
    EmitBooleanExpression(pPVar4->pnode1,trueLabel_00,BVar2,byteCodeGenerator,funcInfo,false,true);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar5,BVar2);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar1 = LdTrue;
    if (reuseLoc) {
      OVar1 = LdTrue_ReuseLoc;
    }
    Js::ByteCodeWriter::Reg1(pBVar5,OVar1,writeto);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Br(pBVar5,trueLabel);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar5,trueLabel_00);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar5,LdFalse_ReuseLoc,writeto);
    if (!falsefallthrough) {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar5,falseLabel);
    }
    pPVar4 = ParseNode::AsParseNodeUni(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar4->pnode1);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    break;
  case knopEq:
  case knopNe:
  case knopLt:
  case knopLe:
  case knopGe:
  case knopGt:
  case knopEqv:
  case knopNEqv:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    pnode1 = pPVar3->pnode1;
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    EmitBinaryOpnds(pnode1,pPVar3->pnode2,byteCodeGenerator,funcInfo,0xffffffff);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode2);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode1);
    FuncInfo::AcquireLoc(funcInfo,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar1 = nopToCMOp[expr->nop];
    R0 = expr->location;
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    R1 = pPVar3->pnode1->location;
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    Js::ByteCodeWriter::Reg3(pBVar5,OVar1,R0,R1,pPVar3->pnode2->location);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar1 = Ld_A;
    if (reuseLoc) {
      OVar1 = Ld_A_ReuseLoc;
    }
    Js::ByteCodeWriter::Reg2(pBVar5,OVar1,writeto,expr->location);
    if ((truefallthrough) || (falsefallthrough)) {
      if ((!truefallthrough) || (falsefallthrough)) {
        if ((falsefallthrough) && (!truefallthrough)) {
          pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
          Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
        }
      }
      else {
        pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::BrReg1(pBVar5,BrFalse_A,falseLabel,expr->location);
      }
    }
    else {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg1(pBVar5,BrTrue_A,trueLabel,expr->location);
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar5,falseLabel);
    }
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    break;
  case knopLogOr:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar2 = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    EmitGeneratingBooleanExpression
              (pPVar3->pnode1,trueLabel,false,BVar2,true,writeto,reuseLoc,byteCodeGenerator,funcInfo
              );
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode1);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar5,BVar2);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    EmitGeneratingBooleanExpression
              (pPVar3->pnode2,trueLabel,truefallthrough,falseLabel,falsefallthrough,writeto,true,
               byteCodeGenerator,funcInfo);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode2);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
    break;
  case knopLogAnd:
    ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    BVar2 = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    EmitGeneratingBooleanExpression
              (pPVar3->pnode1,BVar2,true,falseLabel,false,writeto,reuseLoc,byteCodeGenerator,
               funcInfo);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode1);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::MarkLabel(pBVar5,BVar2);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    EmitGeneratingBooleanExpression
              (pPVar3->pnode2,trueLabel,truefallthrough,falseLabel,falsefallthrough,writeto,true,
               byteCodeGenerator,funcInfo);
    pPVar3 = ParseNode::AsParseNodeBin(expr);
    FuncInfo::ReleaseLoc(funcInfo,pPVar3->pnode2);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,expr);
  }
  return;
}

Assistant:

void EmitGeneratingBooleanExpression(ParseNode *expr, Js::ByteCodeLabel trueLabel, bool truefallthrough, Js::ByteCodeLabel falseLabel, bool falsefallthrough, Js::RegSlot writeto,
    bool reuseLoc, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    switch (expr->nop)
    {

    case knopLogOr:
    {
        byteCodeGenerator->StartStatement(expr);
        Js::ByteCodeLabel leftFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode1, trueLabel, false, leftFalse, true, writeto, reuseLoc, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftFalse);
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, truefallthrough, falseLabel, falsefallthrough, writeto, true, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        byteCodeGenerator->EndStatement(expr);
        break;
    }

    case knopLogAnd:
    {
        byteCodeGenerator->StartStatement(expr);
        Js::ByteCodeLabel leftTrue = byteCodeGenerator->Writer()->DefineLabel();
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode1, leftTrue, true, falseLabel, false, writeto, reuseLoc, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftTrue);
        EmitGeneratingBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, truefallthrough, falseLabel, falsefallthrough, writeto, true, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        byteCodeGenerator->EndStatement(expr);
        break;
    }

    case knopLogNot:
    {
        byteCodeGenerator->StartStatement(expr);
        // this time we want a boolean expression, since Logical Not is nice and only returns true or false
        Js::ByteCodeLabel emitTrue = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel emitFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeUni()->pnode1, emitFalse, emitTrue, byteCodeGenerator, funcInfo, false, true);
        byteCodeGenerator->Writer()->MarkLabel(emitTrue);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdTrue_ReuseLoc : Js::OpCode::LdTrue, writeto);
        byteCodeGenerator->Writer()->Br(trueLabel);
        byteCodeGenerator->Writer()->MarkLabel(emitFalse);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, writeto);
        if (!falsefallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        funcInfo->ReleaseLoc(expr->AsParseNodeUni()->pnode1);
        byteCodeGenerator->EndStatement(expr);
        break;
    }
    case knopEq:
    case knopEqv:
    case knopNEqv:
    case knopNe:
    case knopLt:
    case knopLe:
    case knopGe:
    case knopGt:
        byteCodeGenerator->StartStatement(expr);
        EmitBinaryOpnds(expr->AsParseNodeBin()->pnode1, expr->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        funcInfo->AcquireLoc(expr);
        byteCodeGenerator->Writer()->Reg3(nopToCMOp[expr->nop], expr->location, expr->AsParseNodeBin()->pnode1->location,
            expr->AsParseNodeBin()->pnode2->location);
        byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
        // The inliner likes small bytecode
        if (!(truefallthrough || falsefallthrough))
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        else if (truefallthrough && !falsefallthrough) {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
        }
        else if (falsefallthrough && !truefallthrough) {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    case knopTrue:
        byteCodeGenerator->StartStatement(expr);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdTrue_ReuseLoc : Js::OpCode::LdTrue, writeto);
        if (!truefallthrough)
        {
            byteCodeGenerator->Writer()->Br(trueLabel);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    case knopFalse:
        byteCodeGenerator->StartStatement(expr);
        byteCodeGenerator->Writer()->Reg1(reuseLoc ? Js::OpCode::LdFalse_ReuseLoc : Js::OpCode::LdFalse, writeto);
        if (!falsefallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        byteCodeGenerator->EndStatement(expr);
        break;
    default:
        // Note: we usually release the temp assigned to a node after we Emit it.
        // But in this case, EmitBooleanExpression is just a wrapper around a normal Emit call,
        // and the caller of EmitBooleanExpression expects to be able to release this register.

        // For diagnostics purposes, register the name and dot to the statement list.
        if (expr->nop == knopName || expr->nop == knopDot)
        {
            byteCodeGenerator->StartStatement(expr);
            Emit(expr, byteCodeGenerator, funcInfo, false);
            byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
            // The inliner likes small bytecode
            if (!(truefallthrough || falsefallthrough))
            {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
            else if (truefallthrough && !falsefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
            }
            else if (falsefallthrough && !truefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            }
            byteCodeGenerator->EndStatement(expr);
        }
        else
        {
            Emit(expr, byteCodeGenerator, funcInfo, false);
            byteCodeGenerator->Writer()->Reg2(reuseLoc ? Js::OpCode::Ld_A_ReuseLoc : Js::OpCode::Ld_A, writeto, expr->location);
            // The inliner likes small bytecode
            if (!(truefallthrough || falsefallthrough))
            {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
            else if (truefallthrough && !falsefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
            }
            else if (falsefallthrough && !truefallthrough) {
                byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            }
        }
        break;
    }
}